

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O3

double __thiscall prometheus::detail::CKMSQuantiles::get(CKMSQuantiles *this,double q)

{
  pointer pIVar1;
  double dVar2;
  pointer pIVar3;
  pointer pIVar4;
  int iVar5;
  pointer pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  
  insertBatch(this);
  compress(this);
  pIVar6 = (this->sample_).
           super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->sample_).
           super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar6 == pIVar1) {
    uVar7 = 0;
    uVar8 = 0x7ff80000;
  }
  else {
    dVar9 = (((double)CONCAT44(0x45300000,(int)(this->count_ >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->count_) - 4503599627370496.0)) * q;
    dVar2 = allowableError(this,(int)dVar9);
    pIVar6 = pIVar6 + -1;
    iVar5 = 0;
    do {
      if (pIVar6 + 2 == pIVar1) {
        pIVar6 = pIVar1 + -1;
        break;
      }
      iVar5 = iVar5 + pIVar6[1].g;
      pIVar3 = pIVar6 + 2;
      pIVar4 = pIVar6 + 2;
      pIVar6 = pIVar6 + 1;
    } while ((double)(pIVar3->g + iVar5 + pIVar4->delta) <= dVar2 * 0.5 + (double)(int)dVar9);
    uVar7 = SUB84(pIVar6->value,0);
    uVar8 = (undefined4)((ulong)pIVar6->value >> 0x20);
  }
  return (double)CONCAT44(uVar8,uVar7);
}

Assistant:

double CKMSQuantiles::get(double q) {
  insertBatch();
  compress();

  if (sample_.empty()) {
    return std::numeric_limits<double>::quiet_NaN();
  }

  int rankMin = 0;
  const auto desired = static_cast<int>(q * count_);
  const auto bound = desired + (allowableError(desired) / 2);

  auto it = sample_.begin();
  decltype(it) prev;
  auto cur = it++;

  while (it != sample_.end()) {
    prev = cur;
    cur = it++;

    rankMin += prev->g;

    if (rankMin + cur->g + cur->delta > bound) {
      return prev->value;
    }
  }

  return sample_.back().value;
}